

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t zesGetRasExpProcAddrTable(ze_api_version_t version,zes_ras_exp_dditable_t *pDdiTable)

{
  zes_pfnRasClearStateExp_t p_Var1;
  ze_api_version_t *pzVar2;
  ze_result_t zVar3;
  
  pzVar2 = validation_layer::context;
  if (pDdiTable == (zes_ras_exp_dditable_t *)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnClearStateExp;
      *(zes_pfnRasGetStateExp_t *)(validation_layer::context + 0x330) = pDdiTable->pfnGetStateExp;
      *(zes_pfnRasClearStateExp_t *)(pzVar2 + 0x332) = p_Var1;
      pDdiTable->pfnGetStateExp = validation_layer::zesRasGetStateExp;
      pDdiTable->pfnClearStateExp = validation_layer::zesRasClearStateExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetRasExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_ras_exp_dditable_t* pDdiTable               ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.RasExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetStateExp                              = pDdiTable->pfnGetStateExp;
    pDdiTable->pfnGetStateExp                            = validation_layer::zesRasGetStateExp;

    dditable.pfnClearStateExp                            = pDdiTable->pfnClearStateExp;
    pDdiTable->pfnClearStateExp                          = validation_layer::zesRasClearStateExp;

    return result;
}